

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMap.c
# Opt level: O0

If_Obj_t * Lpk_MapPrime(Lpk_Man_t *p,uint *pTruth,int nVars,If_Obj_t **ppLeaves)

{
  int c;
  Kit_Graph_t *pGraph_00;
  Kit_Node_t *pKVar1;
  If_Obj_t *p_00;
  int local_4c;
  int i;
  If_Obj_t *pRes;
  Kit_Node_t *pNode;
  Kit_Graph_t *pGraph;
  If_Obj_t **ppLeaves_local;
  int nVars_local;
  uint *pTruth_local;
  Lpk_Man_t *p_local;
  
  pGraph_00 = Kit_TruthToGraph(pTruth,nVars,p->vCover);
  if (pGraph_00 == (Kit_Graph_t *)0x0) {
    p_local = (Lpk_Man_t *)0x0;
  }
  else {
    for (local_4c = 0; local_4c < pGraph_00->nLeaves; local_4c = local_4c + 1) {
      pKVar1 = Kit_GraphNode(pGraph_00,local_4c);
      pKVar1->field_2 = *(anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)(ppLeaves + local_4c);
    }
    p_00 = Lpk_MapPrimeInternal(p->pIfMan,pGraph_00);
    c = Kit_GraphIsComplement(pGraph_00);
    p_local = (Lpk_Man_t *)If_NotCond(p_00,c);
    Kit_GraphFree(pGraph_00);
  }
  return (If_Obj_t *)p_local;
}

Assistant:

If_Obj_t * Lpk_MapPrime( Lpk_Man_t * p, unsigned * pTruth, int nVars, If_Obj_t ** ppLeaves )
{
    Kit_Graph_t * pGraph;
    Kit_Node_t * pNode;
    If_Obj_t * pRes;
    int i;
    // derive the factored form
    pGraph = Kit_TruthToGraph( pTruth, nVars, p->vCover );
    if ( pGraph == NULL )
        return NULL;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = ppLeaves[i];
    // perform strashing
    pRes = Lpk_MapPrimeInternal( p->pIfMan, pGraph );
    pRes = If_NotCond( pRes, Kit_GraphIsComplement(pGraph) );
    Kit_GraphFree( pGraph );
    return pRes;
}